

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O0

char * toCString(string *s)

{
  char *__result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  unaff_retaddr;
  char *out;
  size_t in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::size();
  __result = callocArrayType<char>(in_stack_ffffffffffffffe0);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
            (unaff_retaddr,in_RDI,__result);
  return __result;
}

Assistant:

static inline char *toCString(const std::string &s)
{
    auto out = callocArrayType<char>(s.size()+1);
    std::copy(s.begin(), s.end(), out);
    return out;
}